

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void lowerFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint n;
  uchar *puVar1;
  char *z;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = sqlite3_value_text(*argv);
  n = sqlite3_value_bytes(*argv);
  if ((puVar1 != (uchar *)0x0) &&
     (z = (char *)contextMalloc(context,(long)(int)n + 1), z != (char *)0x0)) {
    uVar2 = 0;
    uVar3 = (ulong)n;
    if ((int)n < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      z[uVar2] = ""[puVar1[uVar2]];
    }
    sqlite3_result_text(context,z,n,sqlite3_free);
    return;
  }
  return;
}

Assistant:

static void lowerFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  char *z1;
  const char *z2;
  int i, n;
  UNUSED_PARAMETER(argc);
  z2 = (char*)sqlite3_value_text(argv[0]);
  n = sqlite3_value_bytes(argv[0]);
  /* Verify that the call to _bytes() does not invalidate the _text() pointer */
  assert( z2==(char*)sqlite3_value_text(argv[0]) );
  if( z2 ){
    z1 = contextMalloc(context, ((i64)n)+1);
    if( z1 ){
      for(i=0; i<n; i++){
        z1[i] = sqlite3Tolower(z2[i]);
      }
      sqlite3_result_text(context, z1, n, sqlite3_free);
    }
  }
}